

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builtins.h
# Opt level: O2

void __thiscall
slang::ast::builtins::Builtins::addSystemSubroutine
          (Builtins *this,shared_ptr<slang::ast::SystemSubroutine> *subroutine)

{
  group_type_pointer pgVar1;
  element_type *peVar2;
  group_type_pointer pgVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  int iVar6;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *this_00;
  bool bVar7;
  uint uVar8;
  uint64_t hash;
  byte bVar9;
  ulong uVar10;
  __shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2> *__r;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong pos0;
  undefined1 auVar14 [16];
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  byte bVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  byte bVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
  x;
  try_emplace_args_t local_b1;
  equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *local_b0;
  __shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2> *local_a8;
  ulong local_a0;
  uint64_t local_98;
  ulong local_90;
  ulong local_88;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  locator local_48;
  
  local_b0 = (equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
             &this->subroutineNameMap;
  peVar2 = (subroutine->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  local_80._M_str = (peVar2->name)._M_dataplus._M_p;
  local_80._M_len = (peVar2->name)._M_string_length;
  hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                   ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)local_b0,
                    &local_80);
  this_00 = local_b0;
  pos0 = hash >> ((byte)(this->subroutineNameMap).table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                        .arrays.groups_size_index & 0x3f);
  lVar11 = (hash & 0xff) * 4;
  uVar15 = (&UNK_004a00ac)[lVar11];
  uVar16 = (&UNK_004a00ad)[lVar11];
  uVar17 = (&UNK_004a00ae)[lVar11];
  bVar18 = (&UNK_004a00af)[lVar11];
  uVar13 = (ulong)((uint)hash & 7);
  uVar10 = 0;
  uVar12 = pos0;
  uVar19 = uVar15;
  uVar20 = uVar16;
  uVar21 = uVar17;
  bVar22 = bVar18;
  uVar23 = uVar15;
  uVar24 = uVar16;
  uVar25 = uVar17;
  bVar26 = bVar18;
  uVar27 = uVar15;
  uVar28 = uVar16;
  uVar29 = uVar17;
  bVar30 = bVar18;
  local_a8 = &subroutine->
              super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>;
  do {
    pgVar3 = (this->subroutineNameMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.groups_;
    pgVar1 = pgVar3 + uVar12;
    local_58 = pgVar1->m[0].n;
    uStack_57 = pgVar1->m[1].n;
    uStack_56 = pgVar1->m[2].n;
    bStack_55 = pgVar1->m[3].n;
    uStack_54 = pgVar1->m[4].n;
    uStack_53 = pgVar1->m[5].n;
    uStack_52 = pgVar1->m[6].n;
    bStack_51 = pgVar1->m[7].n;
    uStack_50 = pgVar1->m[8].n;
    uStack_4f = pgVar1->m[9].n;
    uStack_4e = pgVar1->m[10].n;
    bStack_4d = pgVar1->m[0xb].n;
    uStack_4c = pgVar1->m[0xc].n;
    uStack_4b = pgVar1->m[0xd].n;
    uStack_4a = pgVar1->m[0xe].n;
    bVar9 = pgVar1->m[0xf].n;
    auVar14[0] = -(local_58 == uVar15);
    auVar14[1] = -(uStack_57 == uVar16);
    auVar14[2] = -(uStack_56 == uVar17);
    auVar14[3] = -(bStack_55 == bVar18);
    auVar14[4] = -(uStack_54 == uVar19);
    auVar14[5] = -(uStack_53 == uVar20);
    auVar14[6] = -(uStack_52 == uVar21);
    auVar14[7] = -(bStack_51 == bVar22);
    auVar14[8] = -(uStack_50 == uVar23);
    auVar14[9] = -(uStack_4f == uVar24);
    auVar14[10] = -(uStack_4e == uVar25);
    auVar14[0xb] = -(bStack_4d == bVar26);
    auVar14[0xc] = -(uStack_4c == uVar27);
    auVar14[0xd] = -(uStack_4b == uVar28);
    auVar14[0xe] = -(uStack_4a == uVar29);
    auVar14[0xf] = -(bVar9 == bVar30);
    uVar8 = (uint)(ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe);
    bStack_49 = bVar9;
    if (uVar8 != 0) {
      ppVar4 = (this->subroutineNameMap).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
               .arrays.elements_;
      local_a0 = uVar13;
      local_98 = hash;
      local_90 = uVar12;
      local_88 = uVar10;
      local_68 = uVar15;
      uStack_67 = uVar16;
      uStack_66 = uVar17;
      bStack_65 = bVar18;
      uStack_64 = uVar19;
      uStack_63 = uVar20;
      uStack_62 = uVar21;
      bStack_61 = bVar22;
      uStack_60 = uVar23;
      uStack_5f = uVar24;
      uStack_5e = uVar25;
      bStack_5d = bVar26;
      uStack_5c = uVar27;
      uStack_5b = uVar28;
      uStack_5a = uVar29;
      bStack_59 = bVar30;
      do {
        iVar6 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        bVar7 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                          (this_00,&local_80,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           ((long)&ppVar4[uVar12 * 0xf].first._M_len + (ulong)(uint)(iVar6 << 5)));
        __r = local_a8;
        if (bVar7) goto LAB_0040a172;
        uVar8 = uVar8 - 1 & uVar8;
      } while (uVar8 != 0);
      bVar9 = pgVar3[uVar12].m[0xf].n;
      hash = local_98;
      uVar10 = local_88;
      uVar12 = local_90;
      uVar13 = local_a0;
      uVar15 = local_68;
      uVar16 = uStack_67;
      uVar17 = uStack_66;
      bVar18 = bStack_65;
      uVar19 = uStack_64;
      uVar20 = uStack_63;
      uVar21 = uStack_62;
      bVar22 = bStack_61;
      uVar23 = uStack_60;
      uVar24 = uStack_5f;
      uVar25 = uStack_5e;
      bVar26 = bStack_5d;
      uVar27 = uStack_5c;
      uVar28 = uStack_5b;
      uVar29 = uStack_5a;
      bVar30 = bStack_59;
    }
    __r = local_a8;
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[uVar13] & bVar9) == 0) break;
    uVar5 = (this->subroutineNameMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
            .arrays.groups_size_mask;
    lVar11 = uVar12 + uVar10;
    uVar10 = uVar10 + 1;
    uVar12 = lVar11 + 1U & uVar5;
  } while (uVar10 <= uVar5);
  if ((this->subroutineNameMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
      .size_ctrl.size <
      (this->subroutineNameMap).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>&>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
                *)local_b0,pos0,hash,&local_b1,&local_80,
               (shared_ptr<slang::ast::SystemSubroutine> *)local_a8);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>&>
              (&local_48,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
                *)local_b0,hash,&local_b1,&local_80,
               (shared_ptr<slang::ast::SystemSubroutine> *)local_a8);
  }
LAB_0040a172:
  std::__shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->systemSubroutines).
              super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(int)__r->_M_ptr->knownNameId].
              super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>,__r);
  return;
}

Assistant:

void addSystemSubroutine(std::shared_ptr<SystemSubroutine> subroutine) {
        SLANG_ASSERT(subroutine->knownNameId != KnownSystemName::Unknown);
        SLANG_ASSERT(!systemSubroutines[(size_t)subroutine->knownNameId]);
        subroutineNameMap.emplace(subroutine->name, subroutine);
        systemSubroutines[(size_t)subroutine->knownNameId] = std::move(subroutine);
    }